

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

uint8_t * __thiscall
google::protobuf::GeneratedCodeInfo_Annotation::_InternalSerialize
          (GeneratedCodeInfo_Annotation *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  RepeatedField<int> *this_00;
  int *piVar1;
  bool bVar2;
  anon_union_56_1_493b367e_for_GeneratedCodeInfo_Annotation_10 aVar3;
  int iVar4;
  int *piVar5;
  uint8_t *puVar6;
  byte *extraout_RAX;
  byte *pbVar7;
  ulong in_RCX;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  char *in_R9;
  undefined8 *puVar12;
  string_view s;
  string_view field_name;
  
  uVar11 = *(uint *)((long)&this->field_0 + 0x18);
  if ((int)uVar11 < 1) {
LAB_003e52e2:
    aVar3 = this->field_0;
    if (((undefined1  [56])aVar3 & (undefined1  [56])0x1) != (undefined1  [56])0x0) {
      puVar12 = (undefined8 *)
                ((ulong)(this->field_0)._impl_.source_file_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
      field_name._M_str = in_R9;
      field_name._M_len = (size_t)"google.protobuf.GeneratedCodeInfo.Annotation.source_file";
      internal::WireFormatLite::VerifyUtf8String
                ((WireFormatLite *)*puVar12,(char *)(ulong)*(uint *)(puVar12 + 1),1,0x38,field_name)
      ;
      s._M_str = (char *)*puVar12;
      s._M_len = puVar12[1];
      target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,2,s,target);
    }
    if (((undefined1  [56])aVar3 & (undefined1  [56])0x2) != (undefined1  [56])0x0) {
      target = internal::WireFormatLite::WriteInt32ToArrayWithField<3>
                         (stream,(this->field_0)._impl_.begin_,target);
    }
    if (((undefined1  [56])aVar3 & (undefined1  [56])0x4) != (undefined1  [56])0x0) {
      target = internal::WireFormatLite::WriteInt32ToArrayWithField<4>
                         (stream,(this->field_0)._impl_.end_,target);
    }
    if (((undefined1  [56])aVar3 & (undefined1  [56])0x8) == (undefined1  [56])0x0)
    goto LAB_003e5392;
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar9 = (ulong)(this->field_0)._impl_.semantic_;
    pbVar7 = target + 1;
    *target = 0x28;
    in_RCX = uVar9;
    if (0x7f < uVar9) goto LAB_003e540f;
  }
  else {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    if (target < stream->end_) {
      this_00 = &(this->field_0)._impl_.path_;
      *target = 10;
      pbVar7 = target + 1;
      uVar10 = uVar11;
      if (0x7f < uVar11) {
        do {
          target = pbVar7;
          *target = (byte)uVar10 | 0x80;
          uVar11 = uVar10 >> 7;
          pbVar7 = target + 1;
          bVar2 = 0x3fff < uVar10;
          uVar10 = uVar11;
        } while (bVar2);
      }
      *pbVar7 = (byte)uVar11;
      if ((undefined1  [16])((undefined1  [16])(this_00->soo_rep_).field_0 & (undefined1  [16])0x4)
          == (undefined1  [16])0x0) {
        piVar5 = (int *)((long)&this->field_0 + 0x10);
      }
      else {
        piVar5 = (int *)internal::LongSooRep::elements((LongSooRep *)this_00);
      }
      target = target + 2;
      iVar4 = internal::SooRep::size
                        (&this_00->soo_rep_,
                         (undefined1  [16])
                         ((undefined1  [16])(this_00->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                         (undefined1  [16])0x0);
      piVar1 = piVar5 + iVar4;
      do {
        if (stream->end_ <= target) {
          target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        uVar8 = (ulong)*piVar5;
        uVar9 = uVar8;
        if (0x7f < uVar8) {
          do {
            *target = (byte)uVar9 | 0x80;
            uVar8 = uVar9 >> 7;
            target = target + 1;
            bVar2 = 0x3fff < uVar9;
            uVar9 = uVar8;
          } while (bVar2);
        }
        piVar5 = piVar5 + 1;
        *target = (byte)uVar8;
        target = target + 1;
      } while (piVar5 < piVar1);
      goto LAB_003e52e2;
    }
    _InternalSerialize();
    pbVar7 = extraout_RAX;
LAB_003e540f:
    do {
      *pbVar7 = (byte)in_RCX | 0x80;
      uVar9 = in_RCX >> 7;
      pbVar7 = pbVar7 + 1;
      bVar2 = 0x3fff < in_RCX;
      in_RCX = uVar9;
    } while (bVar2);
  }
  *pbVar7 = (byte)uVar9;
  target = pbVar7 + 1;
LAB_003e5392:
  uVar9 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar9 & 1) != 0) {
    puVar6 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar9 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar6;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL GeneratedCodeInfo_Annotation::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const GeneratedCodeInfo_Annotation& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.GeneratedCodeInfo.Annotation)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated int32 path = 1 [packed = true];
  {
    int byte_size = this_._impl_._path_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          1, this_._internal_path(), byte_size, target);
    }
  }

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional string source_file = 2;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_source_file();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.GeneratedCodeInfo.Annotation.source_file");
    target = stream->WriteStringMaybeAliased(2, _s, target);
  }

  // optional int32 begin = 3;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<3>(
            stream, this_._internal_begin(), target);
  }

  // optional int32 end = 4;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<4>(
            stream, this_._internal_end(), target);
  }

  // optional .google.protobuf.GeneratedCodeInfo.Annotation.Semantic semantic = 5;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        5, this_._internal_semantic(), target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.GeneratedCodeInfo.Annotation)
  return target;
}